

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_ary_heap.hpp
# Opt level: O2

void __thiscall
boost::
d_ary_heap_indirect<unsigned_long,_4UL,_boost::iterator_property_map<unsigned_long_*,_boost::vec_adj_list_vertex_id_map<boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_unsigned_long>,_unsigned_long,_unsigned_long_&>,_boost::iterator_property_map<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_boost::vec_adj_list_vertex_id_map<boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_unsigned_long>,_double,_double_&>,_std::less<double>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
::preserve_heap_property_up
          (d_ary_heap_indirect<unsigned_long,_4UL,_boost::iterator_property_map<unsigned_long_*,_boost::vec_adj_list_vertex_id_map<boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_unsigned_long>,_unsigned_long,_unsigned_long_&>,_boost::iterator_property_map<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_boost::vec_adj_list_vertex_id_map<boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_unsigned_long>,_double,_double_&>,_std::less<double>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
           *this,size_type index)

{
  pointer puVar1;
  double *pdVar2;
  unsigned_long uVar3;
  unsigned_long *puVar4;
  unsigned_long uVar5;
  long lVar6;
  size_type orig_index;
  ulong uVar7;
  size_type sVar8;
  bool bVar9;
  
  if (index != 0) {
    puVar1 = (this->data).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar2 = (this->distance).iter._M_current;
    lVar6 = 0;
    uVar3 = puVar1[index];
    sVar8 = index;
    while ((sVar8 != 0 && (sVar8 = sVar8 - 1 >> 2, pdVar2[uVar3] < pdVar2[puVar1[sVar8]]))) {
      lVar6 = lVar6 + 1;
    }
    puVar4 = (this->index_in_heap).iter;
    while (bVar9 = lVar6 != 0, lVar6 = lVar6 + -1, bVar9) {
      uVar7 = index - 1 >> 2;
      uVar5 = puVar1[uVar7];
      puVar4[uVar5] = index;
      puVar1[index] = uVar5;
      index = uVar7;
    }
    puVar1[index] = uVar3;
    puVar4[uVar3] = index;
  }
  return;
}

Assistant:

void preserve_heap_property_up(size_type index) {
      size_type orig_index = index;
      size_type num_levels_moved = 0;
      // The first loop just saves swaps that need to be done in order to avoid
      // aliasing issues in its search; there is a second loop that does the
      // necessary swap operations
      if (index == 0) return; // Do nothing on root
      Value currently_being_moved = data[index];
      distance_type currently_being_moved_dist =
        get(distance, currently_being_moved);
      for (;;) {
        if (index == 0) break; // Stop at root
        size_type parent_index = parent(index);
        Value parent_value = data[parent_index];
        if (compare(currently_being_moved_dist, get(distance, parent_value))) {
          ++num_levels_moved;
          index = parent_index;
          continue;
        } else {
          break; // Heap property satisfied
        }
      }
      // Actually do the moves -- move num_levels_moved elements down in the
      // tree, then put currently_being_moved at the top
      index = orig_index;
      for (size_type i = 0; i < num_levels_moved; ++i) {
        size_type parent_index = parent(index);
        Value parent_value = data[parent_index];
        put(index_in_heap, parent_value, index);
        data[index] = parent_value;
        index = parent_index;
      }
      data[index] = currently_being_moved;
      put(index_in_heap, currently_being_moved, index);
      verify_heap();
    }